

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableLoadSettings(ImGuiTable *table)

{
  ImGuiContext_conflict1 *pIVar1;
  ImGuiTableSettings *p;
  ulong uVar2;
  ImGuiTableColumn *pIVar3;
  long lVar4;
  byte bVar5;
  ulong uVar6;
  long lVar7;
  byte *pbVar8;
  long lVar9;
  char *pcVar10;
  int iVar11;
  _Bool _Var12;
  uint uVar13;
  ulong uVar14;
  
  pIVar1 = GImGui;
  table->IsSettingsRequestLoad = false;
  if ((table->Flags & 0x10) == 0) {
    if (table->SettingsOffset == -1) {
      p = TableSettingsFindByID(table->ID);
      if (p == (ImGuiTableSettings *)0x0) {
        return;
      }
      if (table->ColumnsCount != (int)p->ColumnsCount) {
        table->IsSettingsDirty = true;
      }
      iVar11 = ImChunkStream<ImGuiTableSettings>::offset_from_ptr(&pIVar1->SettingsTables,p);
      table->SettingsOffset = iVar11;
    }
    else {
      p = TableGetBoundSettings(table);
    }
    table->SettingsLoadedFlags = p->SaveFlags;
    table->RefScale = p->RefScale;
    uVar6 = (ulong)p->ColumnsCount;
    if ((long)uVar6 < 1) {
      uVar6 = ~(-1L << (p->ColumnsCount & 0x3fU));
      uVar2 = 0;
    }
    else {
      pbVar8 = (byte *)((long)&p[1].RefScale + 3);
      iVar11 = 0;
      uVar2 = 0;
      do {
        uVar13 = (uint)(char)pbVar8[-3];
        uVar14 = (ulong)uVar13;
        if ((-1 < (int)uVar13) && ((int)uVar13 < table->ColumnsCount)) {
          pIVar3 = (table->Columns).Data + (int)uVar13;
          if ((table->Columns).DataEnd <= pIVar3) goto LAB_002124da;
          uVar13 = p->SaveFlags;
          if ((uVar13 & 1) != 0) {
            *(undefined4 *)((long)&pIVar3->WidthRequest + (ulong)(*pbVar8 & 8)) =
                 *(undefined4 *)(pbVar8 + -0xb);
            pIVar3->AutoFitQueue = '\0';
          }
          if ((uVar13 & 2) != 0) {
            uVar14 = (ulong)pbVar8[-2];
          }
          pIVar3->DisplayOrder = (ImGuiTableColumnIdx)uVar14;
          uVar2 = uVar2 | 1L << (uVar14 & 0x3f);
          _Var12 = (_Bool)(*pbVar8 >> 2 & 1);
          pIVar3->IsUserEnabledNextFrame = _Var12;
          pIVar3->IsUserEnabled = _Var12;
          pIVar3->SortOrder = pbVar8[-1];
          pIVar3->field_0x65 = pIVar3->field_0x65 & 0xfc | *pbVar8 & 3;
          uVar6 = (ulong)(byte)p->ColumnsCount;
        }
        iVar11 = iVar11 + 1;
        bVar5 = (byte)uVar6;
        pbVar8 = pbVar8 + 0xc;
      } while (iVar11 < (char)bVar5);
      uVar6 = ~(-1L << (bVar5 & 0x3f));
      if (bVar5 == 0x40) {
        uVar6 = 0xffffffffffffffff;
      }
    }
    uVar13 = table->ColumnsCount;
    if (uVar2 == uVar6) {
      if ((int)uVar13 < 1) {
        return;
      }
    }
    else {
      if ((int)uVar13 < 1) {
        return;
      }
      pIVar3 = (table->Columns).Data;
      uVar6 = 0;
      do {
        if ((table->Columns).DataEnd <= pIVar3) goto LAB_002124da;
        pIVar3->DisplayOrder = (ImGuiTableColumnIdx)uVar6;
        uVar6 = uVar6 + 1;
        pIVar3 = pIVar3 + 1;
      } while (uVar13 != uVar6);
    }
    lVar4 = 0;
    lVar7 = 0;
    do {
      pIVar3 = (table->Columns).Data;
      if ((table->Columns).DataEnd <= (ImGuiTableColumn *)((long)&pIVar3->Flags + lVar4)) {
LAB_002124da:
        pcVar10 = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
LAB_00212506:
        __assert_fail("p >= Data && p < DataEnd",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_internal.h"
                      ,0x24a,pcVar10);
      }
      lVar9 = (long)(&pIVar3->DisplayOrder)[lVar4];
      if ((lVar9 < 0) ||
         (pcVar10 = (table->DisplayOrderToIndex).Data + lVar9,
         (table->DisplayOrderToIndex).DataEnd <= pcVar10)) {
        pcVar10 = "T &ImSpan<signed char>::operator[](int) [T = signed char]";
        goto LAB_00212506;
      }
      *pcVar10 = (char)lVar7;
      lVar7 = lVar7 + 1;
      lVar4 = lVar4 + 0x68;
    } while (lVar7 < table->ColumnsCount);
  }
  return;
}

Assistant:

void ImGui::TableLoadSettings(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    table->IsSettingsRequestLoad = false;
    if (table->Flags & ImGuiTableFlags_NoSavedSettings)
        return;

    // Bind settings
    ImGuiTableSettings* settings;
    if (table->SettingsOffset == -1)
    {
        settings = TableSettingsFindByID(table->ID);
        if (settings == NULL)
            return;
        if (settings->ColumnsCount != table->ColumnsCount) // Allow settings if columns count changed. We could otherwise decide to return...
            table->IsSettingsDirty = true;
        table->SettingsOffset = g.SettingsTables.offset_from_ptr(settings);
    }
    else
    {
        settings = TableGetBoundSettings(table);
    }

    table->SettingsLoadedFlags = settings->SaveFlags;
    table->RefScale = settings->RefScale;

    // Serialize ImGuiTableSettings/ImGuiTableColumnSettings into ImGuiTable/ImGuiTableColumn
    ImGuiTableColumnSettings* column_settings = settings->GetColumnSettings();
    ImU64 display_order_mask = 0;
    for (int data_n = 0; data_n < settings->ColumnsCount; data_n++, column_settings++)
    {
        int column_n = column_settings->Index;
        if (column_n < 0 || column_n >= table->ColumnsCount)
            continue;

        ImGuiTableColumn* column = &table->Columns[column_n];
        if (settings->SaveFlags & ImGuiTableFlags_Resizable)
        {
            if (column_settings->IsStretch)
                column->StretchWeight = column_settings->WidthOrWeight;
            else
                column->WidthRequest = column_settings->WidthOrWeight;
            column->AutoFitQueue = 0x00;
        }
        if (settings->SaveFlags & ImGuiTableFlags_Reorderable)
            column->DisplayOrder = column_settings->DisplayOrder;
        else
            column->DisplayOrder = (ImGuiTableColumnIdx)column_n;
        display_order_mask |= (ImU64)1 << column->DisplayOrder;
        column->IsUserEnabled = column->IsUserEnabledNextFrame = column_settings->IsEnabled;
        column->SortOrder = column_settings->SortOrder;
        column->SortDirection = column_settings->SortDirection;
    }

    // Validate and fix invalid display order data
    const ImU64 expected_display_order_mask = (settings->ColumnsCount == 64) ? ~0 : ((ImU64)1 << settings->ColumnsCount) - 1;
    if (display_order_mask != expected_display_order_mask)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
            table->Columns[column_n].DisplayOrder = (ImGuiTableColumnIdx)column_n;

    // Rebuild index
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        table->DisplayOrderToIndex[table->Columns[column_n].DisplayOrder] = (ImGuiTableColumnIdx)column_n;
}